

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool roaring_bitmap_select(roaring_bitmap_t *bm,uint32_t rank,uint32_t *element)

{
  uint8_t uVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  bitset_container_t *container;
  ulong uVar5;
  uint32_t local_2c;
  
  local_2c = 0;
  if ((bm->high_low_container).size < 1) {
    uVar5 = 0;
    bVar2 = false;
  }
  else {
    uVar5 = 0;
    do {
      container = (bitset_container_t *)(bm->high_low_container).containers[uVar5];
      uVar1 = (bm->high_low_container).typecodes[uVar5];
      if (uVar1 == '\x04') {
        uVar1 = *(uint8_t *)&container->words;
        container = *(bitset_container_t **)container;
      }
      if (uVar1 == '\x03') {
        bVar2 = 0 < container->cardinality;
        if (0 < container->cardinality) {
          bVar2 = true;
          lVar4 = 0;
          do {
            uVar3 = *(ushort *)((long)container->words + lVar4 * 4 + 2) + local_2c;
            if (rank <= uVar3) {
              *element = (rank - local_2c) + (uint)*(ushort *)((long)container->words + lVar4 * 4);
              break;
            }
            local_2c = uVar3 + 1;
            lVar4 = lVar4 + 1;
            bVar2 = lVar4 < container->cardinality;
          } while (lVar4 < container->cardinality);
        }
      }
      else if (uVar1 == '\x02') {
        uVar3 = container->cardinality + local_2c;
        if (rank < uVar3) {
          *element = (uint)*(ushort *)((long)container->words + (ulong)(rank - local_2c) * 2);
          bVar2 = true;
        }
        else {
          bVar2 = false;
          local_2c = uVar3;
        }
      }
      else {
        bVar2 = bitset_container_select(container,&local_2c,rank,element);
      }
      uVar5 = uVar5 + 1;
      if (bVar2 != false) goto LAB_00121df2;
    } while ((long)uVar5 < (long)(bm->high_low_container).size);
  }
  if (bVar2 != false) {
LAB_00121df2:
    *element = *element | (uint)(bm->high_low_container).keys[(uVar5 & 0xffffffff) - 1] << 0x10;
  }
  return bVar2;
}

Assistant:

bool roaring_bitmap_select(const roaring_bitmap_t *bm, uint32_t rank,
                           uint32_t *element) {
    container_t *container;
    uint8_t typecode;
    uint16_t key;
    uint32_t start_rank = 0;
    int i = 0;
    bool valid = false;
    while (!valid && i < bm->high_low_container.size) {
        container = bm->high_low_container.containers[i];
        typecode = bm->high_low_container.typecodes[i];
        valid =
            container_select(container, typecode, &start_rank, rank, element);
        i++;
    }

    if (valid) {
        key = bm->high_low_container.keys[i - 1];
        *element |= (((uint32_t)key) << 16);  // w/o cast, key promotes signed
        return true;
    } else
        return false;
}